

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolbase.h
# Opt level: O0

void __thiscall
soplex::
LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPColBase(LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int defDim)

{
  uint in_ESI;
  type *in_RDI;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int n;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar1;
  
  infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)CONCAT44(in_ESI,in_stack_ffffffffffffff90),
             (double)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  uVar1 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<200U,_int,_void> *)((ulong)in_ESI << 0x20),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_RDI);
  n = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<200U,_int,_void> *)CONCAT44(in_ESI,uVar1),
             (ulong)in_stack_ffffffffffffff88,in_RDI);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_ESI,uVar1),n);
  return;
}

Assistant:

explicit LPColBase(int defDim = 0)
      : up(R(infinity)), low(0), object(0), vec(defDim)
   {
      assert(isConsistent());
   }